

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void norm_3d(float32 ***arr,uint32 d1,uint32 d2,uint32 d3)

{
  double local_30;
  float64 s;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 d3_local;
  uint32 d2_local;
  uint32 d1_local;
  float32 ***arr_local;
  
  for (k = 0; k < d1; k = k + 1) {
    for (s._4_4_ = 0; s._4_4_ < d2; s._4_4_ = s._4_4_ + 1) {
      local_30 = 0.0;
      for (s._0_4_ = 0; s._0_4_ < d3; s._0_4_ = s._0_4_ + 1) {
        local_30 = (double)(float)arr[k][s._4_4_][s._0_4_] + local_30;
      }
      for (s._0_4_ = 0; s._0_4_ < d3; s._0_4_ = s._0_4_ + 1) {
        arr[k][s._4_4_][s._0_4_] =
             (float32)(float)((double)(float)arr[k][s._4_4_][s._0_4_] * (1.0 / local_30));
      }
    }
  }
  return;
}

Assistant:

void
norm_3d(float32 ***arr,
	uint32 d1,
	uint32 d2,
	uint32 d3)
{
    uint32 i, j, k;
    float64 s;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {

	    /* compute sum (i, j) as over all k */
	    for (k = 0, s = 0; k < d3; k++) {
		s += arr[i][j][k];
	    }

	    /* do 1 floating point divide */
	    s = 1.0 / s;

	    /* divide all k by sum over k */
	    for (k = 0; k < d3; k++) {
		arr[i][j][k] *= s;
	    }
	}
    }
}